

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_layer_t.h
# Opt level: O0

void __thiscall relu_layer_t::activate(relu_layer_t *this)

{
  float *pfVar1;
  tensor_t<float> *in_RDI;
  float v;
  int z;
  int j;
  int i;
  int in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_18 = in_stack_ffffffffffffffdc;
  for (local_c = 0; local_c < in_RDI[1].size.y; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < in_RDI[1].size.z; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < *(int *)&in_RDI[1].field_0x24; local_14 = local_14 + 1) {
        pfVar1 = tensor_t<float>::operator()(in_RDI,(int)local_18,in_stack_ffffffffffffffd8,0);
        local_18 = *pfVar1;
        if (local_18 < 0.0) {
          local_18 = 0.0;
        }
        pfVar1 = tensor_t<float>::operator()(in_RDI,(int)local_18,in_stack_ffffffffffffffd8,0);
        *pfVar1 = local_18;
      }
    }
  }
  return;
}

Assistant:

void activate() {
    for (int i = 0; i < in.size.x; i++)
      for (int j = 0; j < in.size.y; j++)
        for (int z = 0; z < in.size.z; z++) {
          float v = in(i, j, z);
          if (v < 0)
            v = 0;
          out(i, j, z) = v;
        }

  }